

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::Own<kj::AsyncCapabilityStream>_> __thiscall
kj::
NoInfer_<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1823:13)>
::Type::operator()(void *this,Maybe<kj::Own<kj::AsyncCapabilityStream>_> *result)

{
  Own<kj::AsyncCapabilityStream> *other;
  char (*in_RCX) [41];
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  Promise<kj::Own<kj::AsyncCapabilityStream>_> PVar2;
  String local_1b8;
  Exception local_1a0;
  Own<kj::AsyncCapabilityStream> local_38;
  Own<kj::AsyncCapabilityStream> *local_28;
  Own<kj::AsyncCapabilityStream> *r;
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> *result_local;
  Type *this_local;
  
  result_local = result;
  this_local = (Type *)this;
  local_28 = kj::_::readMaybe<kj::AsyncCapabilityStream>(in_RDX);
  if (local_28 == (Own<kj::AsyncCapabilityStream> *)0x0) {
    kj::_::Debug::makeDescription<char_const(&)[41]>
              (&local_1b8,(Debug *)"\"EOF when expecting to receive capability\"",
               "EOF when expecting to receive capability",in_RCX);
    Exception::Exception
              (&local_1a0,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x724,&local_1b8);
    Promise<kj::Own<kj::AsyncCapabilityStream>_>::Promise
              ((Promise<kj::Own<kj::AsyncCapabilityStream>_> *)this,&local_1a0);
    Exception::~Exception(&local_1a0);
    String::~String(&local_1b8);
    pPVar1 = extraout_RDX_00;
  }
  else {
    other = mv<kj::Own<kj::AsyncCapabilityStream>>(local_28);
    Own<kj::AsyncCapabilityStream>::Own(&local_38,other);
    Promise<kj::Own<kj::AsyncCapabilityStream>_>::Promise
              ((Promise<kj::Own<kj::AsyncCapabilityStream>_> *)this,&local_38);
    Own<kj::AsyncCapabilityStream>::~Own(&local_38);
    pPVar1 = extraout_RDX;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::AsyncCapabilityStream>_>)PVar2.super_PromiseBase.node;
}

Assistant:

KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    }